

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O0

bool asmjit::v1_14::x86::x86ShouldUseMovabs
               (Assembler *self,X86BufferWriter *writer,uint32_t regSize,InstOptions options,
               Mem *rmRel)

{
  bool bVar1;
  uint32_t uVar2;
  Mem *rmRel_00;
  size_t sVar3;
  long lVar4;
  InstOptions in_ECX;
  long in_RDI;
  uint *in_R8;
  uint64_t rel64;
  uint64_t rip64;
  uint64_t virtualOffset;
  uint32_t instructionSize;
  uint64_t baseAddress;
  int64_t addrValue;
  uint8_t *in_stack_fffffffffffffe78;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  bool local_111;
  
  if ((*(byte *)(in_RDI + 0x48) & 1) == 1) {
    bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                      (in_ECX,kX86_ModRM|kX86_ModMR);
    local_111 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else if (((*in_R8 >> 0xe & 3) == 2) ||
          (bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                             (in_ECX,kX86_ModRM|kX86_ModMR), bVar1)) {
    local_111 = false;
  }
  else {
    if ((*in_R8 >> 3 & 0x1f) == 0) {
      rmRel_00 = (Mem *)CONCAT44(in_R8[1],in_R8[3]);
    }
    else {
      rmRel_00 = (Mem *)(long)(int)in_R8[3];
    }
    lVar4 = *(long *)(*(long *)(in_RDI + 0x30) + 0x28);
    if ((((*in_R8 >> 0xe & 3) == 0) && (lVar4 != -1)) && ((*in_R8 & 0x1c0000) == 0)) {
      uVar2 = x86GetMovAbsInstSize64Bit
                        ((uint32_t)((ulong)in_R8 >> 0x20),(InstOptions)in_R8,rmRel_00);
      sVar3 = CodeWriter::offsetFrom
                        ((CodeWriter *)
                         CONCAT17(in_stack_fffffffffffffe87,
                                  CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
                         in_stack_fffffffffffffe78);
      lVar4 = (long)rmRel_00 -
              (lVar4 + *(long *)(*(long *)(in_RDI + 0x90) + 0x10) + sVar3 + (ulong)uVar2);
      if (-0x80000001 < lVar4 && lVar4 < 0x80000000) {
        return false;
      }
    }
    else if (-0x80000001 < (long)rmRel_00 && (long)rmRel_00 < 0x80000000) {
      return false;
    }
    local_111 = (Mem *)0xffffffff < rmRel_00;
  }
  return local_111;
}

Assistant:

static ASMJIT_FORCE_INLINE bool x86ShouldUseMovabs(Assembler* self, X86BufferWriter& writer, uint32_t regSize, InstOptions options, const Mem& rmRel) noexcept {
  if (self->is32Bit()) {
    // There is no relative addressing, just decide whether to use MOV encoded with MOD R/M or absolute.
    return !Support::test(options, InstOptions::kX86_ModMR | InstOptions::kX86_ModRM);
  }
  else {
    // If the addressing type is REL or MOD R/M was specified then absolute mov won't be used.
    if (rmRel.addrType() == Mem::AddrType::kRel || Support::test(options, InstOptions::kX86_ModMR | InstOptions::kX86_ModRM))
      return false;

    int64_t addrValue = rmRel.offset();
    uint64_t baseAddress = self->code()->baseAddress();

    // If the address type is default, it means to basically check whether relative addressing is possible. However,
    // this is only possible when the base address is known - relative encoding uses RIP+N it has to be calculated.
    if (rmRel.addrType() == Mem::AddrType::kDefault && baseAddress != Globals::kNoBaseAddress && !rmRel.hasSegment()) {
      uint32_t instructionSize = x86GetMovAbsInstSize64Bit(regSize, options, rmRel);
      uint64_t virtualOffset = uint64_t(writer.offsetFrom(self->_bufferData));
      uint64_t rip64 = baseAddress + self->_section->offset() + virtualOffset + instructionSize;
      uint64_t rel64 = uint64_t(addrValue) - rip64;

      if (Support::isInt32(int64_t(rel64)))
        return false;
    }
    else {
      if (Support::isInt32(addrValue))
        return false;
    }

    return uint64_t(addrValue) > 0xFFFFFFFFu;
  }
}